

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O1

void __thiscall SMC::init_REDCELL(SMC *this,Params *params)

{
  Residue *pRVar1;
  Atom *pAVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  long lVar6;
  ulong uVar7;
  iterator __position;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  vector<double,_std::allocator<double>_> EllipConst2A;
  double local_60;
  vector<double,_std::allocator<double>_> local_58;
  double local_38;
  
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  piVar5 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar5) {
    uVar7 = 0;
    do {
      local_60 = Ellipsoid_Detect(&this->Conf,piVar5[uVar7],
                                  (params->ends).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar7],true);
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_60);
      }
      else {
        *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_60;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar7 = uVar7 + 1;
      piVar5 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(params->starts).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
  }
  piVar5 = (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar5;
  }
  local_60 = (double)CONCAT44(local_60._4_4_,1);
  if (0 < (this->Conf)._numRes) {
    iVar4 = 1;
    do {
      pRVar1 = (this->Conf)._res;
      dVar8 = pRVar1[iVar4]._center.super_Point.x;
      if ((((dVar8 != 0.0) || (NAN(dVar8))) ||
          (dVar8 = pRVar1[iVar4]._center.super_Point.y, dVar8 != 0.0)) ||
         (((NAN(dVar8) || (dVar8 = pRVar1[iVar4]._center.super_Point.z, dVar8 != 0.0)) ||
          (NAN(dVar8))))) {
        piVar5 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar5) {
          uVar7 = 0;
          do {
            pRVar1 = (this->Conf)._res;
            lVar6 = (long)local_60._0_4_;
            pAVar2 = pRVar1[piVar5[uVar7]]._atom;
            dVar10 = pRVar1[lVar6]._center.super_Point.x - pAVar2[1].super_Point.x;
            dVar8 = pRVar1[lVar6]._center.super_Point.y - pAVar2[1].super_Point.y;
            dVar9 = pRVar1[lVar6]._center.super_Point.z - pAVar2[1].super_Point.z;
            dVar8 = dVar9 * dVar9 + dVar10 * dVar10 + dVar8 * dVar8;
            if (dVar8 < 0.0) {
              dVar8 = sqrt(dVar8);
            }
            else {
              dVar8 = SQRT(dVar8);
            }
            pRVar1 = (this->Conf)._res;
            lVar6 = (long)local_60._0_4_;
            pAVar2 = pRVar1[(params->ends).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7]]._atom;
            dVar11 = pRVar1[lVar6]._center.super_Point.x - pAVar2[2].super_Point.x;
            dVar9 = pRVar1[lVar6]._center.super_Point.y - pAVar2[2].super_Point.y;
            dVar10 = pRVar1[lVar6]._center.super_Point.z - pAVar2[2].super_Point.z;
            dVar9 = dVar10 * dVar10 + dVar11 * dVar11 + dVar9 * dVar9;
            if (dVar9 < 0.0) {
              local_38 = dVar8;
              dVar9 = sqrt(dVar9);
              dVar8 = local_38;
            }
            else {
              dVar9 = SQRT(dVar9);
            }
            if (dVar8 + dVar9 <
                local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] +
                Residue::size[(this->Conf)._res[local_60._0_4_]._type] + 5.5) {
              __position._M_current =
                   (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *__position._M_current = local_60._0_4_;
                goto LAB_00136d80;
              }
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->Reslist,__position,
                         (int *)&local_60);
              break;
            }
            uVar7 = uVar7 + 1;
            piVar5 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
          } while (uVar7 < (ulong)((long)(params->starts).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
        }
      }
      else {
        __position._M_current =
             (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->Reslist,__position,(int *)&local_60);
        }
        else {
          *__position._M_current = iVar4;
LAB_00136d80:
          (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      iVar3 = local_60._0_4_;
      iVar4 = local_60._0_4_ + 1;
      local_60 = (double)CONCAT44(local_60._4_4_,iVar4);
    } while (iVar3 < (this->Conf)._numRes);
  }
  if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SMC::init_REDCELL(const struct Params &params) {
    // calculate Ellipsoid constant 2a
    vector<double> EllipConst2A;
    for (int j = 0; j < params.starts.size(); j++)
        EllipConst2A.push_back(Ellipsoid_Detect(this->Conf, params.starts[j], params.ends[j], true));

    this->Reslist.clear();
    // test the space after using ellipsoid and surface
    for (int i = 1; i <= this->Conf._numRes; i++) {
        // Assuming this residue is part of simulated loop region, always include it!
        if (this->Conf._res[i]._center.is_at_origin()) {
            this->Reslist.push_back(i);
            continue;
        }

        for (int j = 0; j < params.starts.size(); j++) {
            const double dis = this->Conf._res[i]._center.dis(this->Conf._res[params.starts[j]]._atom[ATM_CA]) +
                               this->Conf._res[i]._center.dis(this->Conf._res[params.ends[j]]._atom[ATM_C]);
            if (dis < EllipConst2A[j] + Residue::size[this->Conf._res[i]._type] + CUB_SIZE) {
                this->Reslist.push_back(i);
                break;
            }
        }
    }
}